

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicCopyTexImageCubeCase::createTexture(BasicCopyTexImageCubeCase *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  TextureFormat TVar5;
  Context *pCVar6;
  NotSupportedError *this_00;
  bool bVar7;
  int width;
  long lVar8;
  ContextWrapper *this_01;
  int ndx;
  deUint32 tex;
  int local_1c4;
  BasicCopyTexImageCubeCase *local_1c0;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Random rnd;
  GradientShader shader;
  
  iVar1 = (*((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var,iVar1);
  bVar7 = false;
  if ((0 < *(int *)(lVar8 + 8)) && (bVar7 = false, 0 < *(int *)(lVar8 + 0xc))) {
    bVar7 = 0 < *(int *)(lVar8 + 0x10);
  }
  local_1c4 = *(int *)(lVar8 + 0x14);
  TVar5 = mapGLUnsizedInternalFormat(this->m_internalFormat);
  tex = 0;
  dVar2 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_01 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  local_1c0 = this;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_01);
  dVar2 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&shader);
  if ((TVar5.order == A || bVar7) &&
     ((RGBA < TVar5.order || (0xedU >> ((byte)TVar5.order & 0x1f) & 1) != 0) || 0 < local_1c4)) {
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_01);
    tcu::Vector<float,_4>::Vector(&local_1a8,0.0);
    tcu::Vector<float,_4>::Vector(&local_1b8,1.0);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar6,dVar2,&local_1a8,&local_1b8);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_1a8.m_data[0] = -1.0;
    local_1a8.m_data[1] = -1.0;
    local_1a8.m_data[2] = 0.0;
    local_1b8.m_data[0] = 1.0;
    local_1b8.m_data[1] = 1.0;
    local_1b8.m_data[2] = 0.0;
    sglr::drawQuad(pCVar6,dVar2,(Vec3 *)&local_1a8,(Vec3 *)&local_1b8);
    sglr::ContextWrapper::glGenTextures(this_01,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_01,0x8513,tex);
    for (iVar1 = 0; iVar1 < (local_1c0->super_TextureCubeSpecCase).m_numLevels; iVar1 = iVar1 + 1) {
      width = (local_1c0->super_TextureCubeSpecCase).m_size >> ((byte)iVar1 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 4) {
        iVar3 = sglr::ContextWrapper::getWidth(this_01);
        iVar3 = de::Random::getInt(&rnd,0,iVar3 - width);
        iVar4 = sglr::ContextWrapper::getHeight(this_01);
        iVar4 = de::Random::getInt(&rnd,0,iVar4 - width);
        sglr::ContextWrapper::glCopyTexImage2D
                  (this_01,*(deUint32 *)((long)&s_cubeMapFaces + lVar8),iVar1,
                   local_1c0->m_internalFormat,iVar3,iVar4,width,width,0);
      }
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x78f);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= mapGLUnsizedInternalFormat(m_internalFormat);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int x = rnd.getInt(0, getWidth()	- levelSize);
				int y = rnd.getInt(0, getHeight()	- levelSize);

				glCopyTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, x, y, levelSize, levelSize, 0);
			}
		}
	}